

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

size_t cm_strverscmp_find_first_difference_or_end(char *lhs,char *rhs)

{
  bool bVar1;
  size_t local_20;
  size_t i;
  char *rhs_local;
  char *lhs_local;
  
  local_20 = 0;
  while( true ) {
    bVar1 = false;
    if (lhs[local_20] == rhs[local_20]) {
      bVar1 = lhs[local_20] != '\0';
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static size_t cm_strverscmp_find_first_difference_or_end(const char* lhs,
                                                         const char* rhs)
{
  size_t i = 0;
  /* Step forward until we find a difference or both strings end together.
     The difference may lie on the null-terminator of one string.  */
  while (lhs[i] == rhs[i] && lhs[i] != 0) {
    ++i;
  }
  return i;
}